

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool Catch::operator<(TestCaseInfo *lhs,TestCaseInfo *rhs)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((string *)lhs);
  if (iVar2 == 0) {
    iVar2 = StringRef::compare(&lhs->className,rhs->className);
    if (iVar2 == 0) {
      bVar1 = std::operator<(&lhs->tags,&rhs->tags);
      return bVar1;
    }
  }
  return SUB41((uint)iVar2 >> 0x1f,0);
}

Assistant:

bool operator<( TestCaseInfo const& lhs, TestCaseInfo const& rhs ) {
        // We want to avoid redoing the string comparisons multiple times,
        // so we store the result of a three-way comparison before using
        // it in the actual comparison logic.
        const auto cmpName = lhs.name.compare( rhs.name );
        if ( cmpName != 0 ) {
            return cmpName < 0;
        }
        const auto cmpClassName = lhs.className.compare( rhs.className );
        if ( cmpClassName != 0 ) {
            return cmpClassName < 0;
        }
        return lhs.tags < rhs.tags;
    }